

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_postdata_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  undefined4 local_1c;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  if (smtpcode != 0xfa) {
    local_1c = CURLE_WEIRD_SERVER_REPLY;
  }
  smtp_state(data,SMTP_STOP);
  return local_1c;
}

Assistant:

static CURLcode smtp_state_postdata_resp(struct Curl_easy *data,
                                         int smtpcode,
                                         smtpstate instate)
{
  CURLcode result = CURLE_OK;

  (void)instate; /* no use for this yet */

  if(smtpcode != 250)
    result = CURLE_WEIRD_SERVER_REPLY;

  /* End of DONE phase */
  smtp_state(data, SMTP_STOP);

  return result;
}